

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

bool __thiscall ON_Font::IsEngravingFont(ON_Font *this)

{
  bool bVar1;
  Type TVar2;
  long lVar3;
  wchar_t *font_name;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  InternalHashToName *key_00;
  int iVar8;
  ON_wString *pOVar9;
  ON_wString *rhs;
  bool bVar10;
  InternalHashToName key [4];
  bool local_f9;
  ON_wString local_f8 [4];
  undefined1 local_d8 [24];
  undefined8 local_c0;
  InternalHashToName local_b8 [4];
  
  bVar1 = ON_wString::IsNotEmpty(&this->m_loc_family_name);
  pOVar9 = &this->m_loc_family_name;
  if (!bVar1) {
    pOVar9 = &this->m_en_family_name;
  }
  ON_wString::ON_wString(local_f8,pOVar9);
  ON_wString::ON_wString(local_f8 + 1,&this->m_en_family_name);
  bVar1 = ON_wString::IsNotEmpty(&this->m_loc_postscript_name);
  pOVar9 = &this->m_loc_postscript_name;
  if (!bVar1) {
    pOVar9 = &this->m_en_postscript_name;
  }
  ON_wString::ON_wString(local_f8 + 2,pOVar9);
  ON_wString::ON_wString(local_f8 + 3,&this->m_en_postscript_name);
  lVar3 = 0;
  do {
    *(undefined4 *)(local_b8[0].m_dirty_name_hash.m_digest + lVar3 + 0x10) =
         ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
    *(undefined8 *)(local_b8[0].m_dirty_name_hash.m_digest + lVar3) =
         ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
    *(undefined8 *)(local_b8[0].m_dirty_name_hash.m_digest + lVar3 + 8) =
         ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
    *(undefined8 *)((long)(&local_b8[0].m_dirty_name_hash + 1) + lVar3 + 4) = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x80);
  uVar7 = 0;
  local_f9 = true;
  iVar8 = 0;
  do {
    pOVar9 = local_f8 + uVar7;
    bVar1 = ON_wString::IsEmpty(pOVar9);
    bVar10 = false;
    if (!bVar1) {
      bVar1 = ON_wString::IsEmpty(pOVar9);
      if (uVar7 != 0 && !bVar1) {
        uVar6 = 1;
        rhs = local_f8;
        do {
          bVar1 = ::operator==(pOVar9,rhs);
          bVar10 = uVar6 < uVar7;
          rhs = rhs + 1;
          uVar6 = uVar6 + 1;
        } while (bVar10 && !bVar1);
      }
      bVar10 = false;
      if (bVar1 == false) {
        font_name = ON_wString::operator_cast_to_wchar_t_(pOVar9);
        FontNameHash((ON_SHA1_Hash *)local_d8,font_name,true);
        local_c0 = 0;
        key_00 = local_b8 + iVar8;
        *(undefined4 *)(key_00->m_dirty_name_hash).m_digest = local_d8._0_4_;
        *(undefined4 *)(local_b8[iVar8].m_dirty_name_hash.m_digest + 4) = local_d8._4_4_;
        *(undefined4 *)(local_b8[iVar8].m_dirty_name_hash.m_digest + 8) = local_d8._8_4_;
        *(undefined4 *)(local_b8[iVar8].m_dirty_name_hash.m_digest + 0xc) = local_d8._12_4_;
        *(undefined8 *)(local_b8[iVar8].m_dirty_name_hash.m_digest + 0x10) = local_d8._16_8_;
        local_b8[iVar8].m_family_name = (wchar_t *)0x0;
        bVar1 = false;
        if (0 < iVar8) {
          iVar5 = 1;
          do {
            bVar1 = ::operator==(&key_00->m_dirty_name_hash,&local_b8[uVar7].m_dirty_name_hash);
            bVar10 = iVar5 < iVar8;
            iVar5 = iVar5 + 1;
          } while (bVar10 && !bVar1);
        }
        bVar10 = false;
        if (bVar1 == false) {
          if ((Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map == '\0') &&
             (iVar5 = __cxa_guard_acquire(&Internal_IsEngravingFont(InternalHashToName_const*)::
                                           double_line_name_map), iVar5 != 0)) {
            FontNameHash((ON_SHA1_Hash *)
                         Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map,
                         L"OrachTech2Lotf",false);
            Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map._24_8_ =
                 anon_var_dwarf_26c15e;
            FontNameHash((ON_SHA1_Hash *)
                         (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map
                         + 0x20),L"OrachTech2Lotf",false);
            Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map._56_8_ =
                 anon_var_dwarf_26c15e;
            FontNameHash((ON_SHA1_Hash *)
                         (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map
                         + 0x40),L"OrachTechDemo2Lotf",false);
            Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map._88_8_ =
                 anon_var_dwarf_26c16a;
            FontNameHash((ON_SHA1_Hash *)
                         (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map
                         + 0x60),L"OrachTechDemo2Lotf",false);
            Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map._120_8_ =
                 anon_var_dwarf_26c16a;
            FontNameHash((ON_SHA1_Hash *)
                         (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map
                         + 0x80),L"OrachTech2Lttf",false);
            Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map._152_8_ =
                 anon_var_dwarf_26c176;
            FontNameHash((ON_SHA1_Hash *)
                         (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map
                         + 0xa0),L"OrachTech2Lttf",false);
            Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map._184_8_ =
                 anon_var_dwarf_26c176;
            FontNameHash((ON_SHA1_Hash *)
                         (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map
                         + 0xc0),L"OrachTechDemo2Lttf",false);
            Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map._216_8_ =
                 anon_var_dwarf_26c182;
            FontNameHash((ON_SHA1_Hash *)
                         (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map
                         + 0xe0),L"OrachTechDemo2Lttf",false);
            Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map._248_8_ =
                 anon_var_dwarf_26c182;
            __cxa_guard_release(&Internal_IsEngravingFont(InternalHashToName_const*)::
                                 double_line_name_map);
          }
          if (Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map_count == 0)
          {
            Internal_IsEngravingFont(InternalHashToName_const*)::double_line_name_map_count =
                 InternalHashToName::SortAndCullByHash
                           ((InternalHashToName *)
                            Internal_IsEngravingFont(InternalHashToName_const*)::
                            double_line_name_map,8);
          }
          pvVar4 = bsearch(key_00,Internal_IsEngravingFont(InternalHashToName_const*)::
                                  double_line_name_map,
                           Internal_IsEngravingFont(InternalHashToName_const*)::
                           double_line_name_map_count,0x20,InternalHashToName::CompareHash);
          bVar10 = true;
          if (pvVar4 == (void *)0x0) {
            TVar2 = Internal_FigureTypeFromHashedFontName(key_00);
            bVar10 = (TVar2 & (Perimeter|SingleStroke)) == SingleStroke;
          }
          iVar8 = iVar8 + 1;
        }
      }
    }
    if (bVar10) break;
    local_f9 = uVar7 < 3;
    uVar7 = uVar7 + 1;
  } while (uVar7 != 4);
  lVar3 = 0x18;
  do {
    ON_wString::~ON_wString((ON_wString *)((long)&local_f8[0].m_s + lVar3));
    lVar3 = lVar3 + -8;
  } while (lVar3 != -8);
  return local_f9;
}

Assistant:

bool ON_Font::IsEngravingFont() const
{
  const ON_wString names[] =
  {
    FamilyName(),
    FamilyName(ON_Font::NameLocale::English),
    PostScriptName(),
    PostScriptName(ON_Font::NameLocale::English)
  };
  
  InternalHashToName key[sizeof(names)/sizeof(names[0])];

  const int name_count = (int)(sizeof(names) / sizeof(names[0]));
  int key_count = 0;
  for (int i = 0; i < name_count; i++)
  {
    const ON_wString& name = names[i];
    if (name.IsEmpty())
      continue;

    // computing the hash is much more expensive than checking for duplicate names (which is common)
    bool bSkipName = name.IsEmpty();
    for (int j = 0; false == bSkipName && j < i; j++)
      bSkipName = (name == names[j]);
    if (bSkipName)
      continue;

    // compute name hash
    key[key_count] = InternalHashToName(name, nullptr);

    // searching for a duplicate hash is more expensive than checking for duplicate hash 
    // (which is common because of space and hyphen differences between family and postscript names)
    for (int j = 0; false == bSkipName && j < key_count; j++)
      bSkipName = (key[key_count].m_dirty_name_hash == key[i].m_dirty_name_hash);
    if (bSkipName)
      continue;

    // search for matching name hash is lists of known single stroke and double stroke fonts
    bool bIsEngravingFont = Internal_IsEngravingFont(&key[key_count]);
    key_count++;
    if (bIsEngravingFont)
      return true;
  }
  return false;
}